

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  vector<Catch::StringRef,std::allocator<Catch::StringRef>> *this_00;
  vector<Catch::StringRef,std::allocator<Catch::StringRef>> *__s;
  Config *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 this_01;
  unique_ptr<Catch::ColourImpl> colour;
  unique_ptr<Catch::IStream> errStream;
  InternalParseResult result;
  long *local_e0;
  IStream *local_d8;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  pointer local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  InternalParseResult local_90;
  ostream *os;
  
  iVar2 = 1;
  if (this->m_startupExceptions == false) {
    __s = (vector<Catch::StringRef,std::allocator<Catch::StringRef>> *)*argv;
    local_d0._8_8_ = strlen((char *)__s);
    this_00 = (vector<Catch::StringRef,std::allocator<Catch::StringRef>> *)(local_d0 + 0x10);
    local_d0._0_8_ = __s;
    std::vector<Catch::StringRef,std::allocator<Catch::StringRef>>::vector<char_const*const*,void>
              (this_00,argv + 1,argv + argc,(allocator_type *)&local_d8);
    Clara::Detail::ParserBase::parse(&local_90,(ParserBase *)this,(Args *)local_d0);
    this_01 = local_c0._M_allocated_capacity;
    if ((Session *)local_c0._M_allocated_capacity != (Session *)0x0) {
      operator_delete((void *)local_c0._M_allocated_capacity,(long)local_b0 - local_c0._0_8_);
    }
    if (local_90.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.m_type ==
        Ok) {
      if ((this->m_configData).showHelp == true) {
        this_01 = this;
        showHelp(this);
      }
      if ((this->m_configData).libIdentify == true) {
        libIdentify((Session *)this_01);
      }
      pCVar1 = (this->m_config).m_ptr;
      if (pCVar1 != (Config *)0x0) {
        (*(pCVar1->super_IConfig)._vptr_IConfig[1])();
      }
      (this->m_config).m_ptr = (Config *)0x0;
      iVar2 = 0;
    }
    else {
      config(this);
      if (Context::currentContext == (undefined8 *)0x0) {
        Context::currentContext = (undefined8 *)operator_new(0x10);
        *Context::currentContext = 0;
        Context::currentContext[1] = 0;
      }
      *Context::currentContext = (this->m_config).m_ptr;
      local_d0._0_8_ = this_00;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"%stderr","");
      makeStream((Catch *)&local_d8,(string *)local_d0);
      if ((vector<Catch::StringRef,std::allocator<Catch::StringRef>> *)local_d0._0_8_ != this_00) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_c0._M_allocated_capacity + 1));
      }
      makeColourImpl((Catch *)&local_e0,PlatformDefault,local_d8);
      iVar2 = (*local_d8->_vptr_IStream[2])(local_d8);
      os = (ostream *)CONCAT44(extraout_var,iVar2);
      (**(code **)(*local_e0 + 0x10))(local_e0,2);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\nError(s) in input:\n",0x14);
      local_d0._0_8_ = this_00;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d0,local_90.m_errorMessage._M_dataplus._M_p,
                 local_90.m_errorMessage._M_dataplus._M_p + local_90.m_errorMessage._M_string_length
                );
      local_b0 = (pointer)0x0;
      TextFlow::AnsiSkippingString::preprocessString((AnsiSkippingString *)local_d0);
      local_a8 = 0x4f;
      local_98 = 0xffffffffffffffff;
      local_a0 = 2;
      TextFlow::operator<<(os,(Column *)local_d0);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
      if ((vector<Catch::StringRef,std::allocator<Catch::StringRef>> *)local_d0._0_8_ != this_00) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_c0._M_allocated_capacity + 1));
      }
      (**(code **)(*local_e0 + 0x10))(local_e0,0);
      iVar2 = (*local_d8->_vptr_IStream[2])(local_d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)CONCAT44(extraout_var_00,iVar2),"Run with -? for usage\n\n",0x17);
      std::ostream::flush();
      (**(code **)(*local_e0 + 8))(local_e0);
      (*local_d8->_vptr_IStream[1])(local_d8);
      iVar2 = 0xff;
    }
    local_90.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2450;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.m_errorMessage._M_dataplus._M_p != &local_90.m_errorMessage.field_2) {
      operator_delete(local_90.m_errorMessage._M_dataplus._M_p,
                      local_90.m_errorMessage.field_2._M_allocated_capacity + 1);
    }
    local_90.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001b24a8;
    if ((local_90.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.m_type ==
         Ok) && (local_90.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.m_value.
                 m_remainingTokens.m_tokenBuffer.
                 super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_90.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.
                      m_value.m_remainingTokens.m_tokenBuffer.
                      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0
                            .m_value.m_remainingTokens.m_tokenBuffer.
                            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      local_90.super_ResultValueBase<Catch::Clara::Detail::ParseState>.field_0.
                      _24_8_);
    }
  }
  return iVar2;
}

Assistant:

int Session::applyCommandLine( int argc, char const * const * argv ) {
        if( m_startupExceptions )
            return 1;

        auto result = m_cli.parse( Clara::Args( argc, argv ) );

        if( !result ) {
            config();
            getCurrentMutableContext().setConfig(m_config.get());
            auto errStream = makeStream( "%stderr" );
            auto colour = makeColourImpl( ColourMode::PlatformDefault, errStream.get() );

            errStream->stream()
                << colour->guardColour( Colour::Red )
                << "\nError(s) in input:\n"
                << TextFlow::Column( result.errorMessage() ).indent( 2 )
                << "\n\n";
            errStream->stream() << "Run with -? for usage\n\n" << std::flush;
            return MaxExitCode;
        }

        if( m_configData.showHelp )
            showHelp();
        if( m_configData.libIdentify )
            libIdentify();

        m_config.reset();
        return 0;
    }